

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_srv_vh.c
# Opt level: O0

int isobusfs_srv_rx_cg_vh(isobusfs_srv_priv *priv,isobusfs_msg *msg)

{
  int iVar1;
  uint8_t *in_RSI;
  isobusfs_msg *in_RDI;
  int ret;
  int func;
  
  iVar1 = isobusfs_buf_to_function(in_RSI);
  isobusfs_srv_send_error(_ret,in_RDI,(isobusfs_error)((ulong)in_RSI >> 0x20));
  isobusfs_log(2,"%s: unsupported function: %i","isobusfs_srv_rx_cg_vh",iVar1);
  return 0;
}

Assistant:

int isobusfs_srv_rx_cg_vh(struct isobusfs_srv_priv *priv,
			  struct isobusfs_msg *msg)
{
	int func = isobusfs_buf_to_function(msg->buf);
	int ret = 0;

	switch (func) {
	/* TODO: currently not implemented */
	case ISOBUSFS_VA_F_INITIALIZE_VOLUME_REQ: /* fall through */
	default:
		isobusfs_srv_send_error(priv, msg,
					ISOBUSFS_ERR_FUNC_NOT_SUPPORTED);
		pr_warn("%s: unsupported function: %i", __func__, func);
	}

	return ret;
}